

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
unary_evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>,_Eigen::internal::IndexBased,_float>
::unary_evaluator(unary_evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>,_Eigen::internal::IndexBased,_float>
                  *this,XprType *replicate)

{
  PointerType pfVar1;
  undefined8 uVar2;
  XprTypeNested pMVar3;
  long lVar4;
  _MatrixTypeNested *p_Var5;
  Index IVar6;
  XprType *replicate_local;
  unary_evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>,_Eigen::internal::IndexBased,_float>
  *this_local;
  
  evaluator_base<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>
  ::evaluator_base((evaluator_base<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>
                    *)this);
  p_Var5 = Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>
           ::nestedExpression(replicate);
  pfVar1 = (p_Var5->
           super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>).
           super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.
           m_data;
  uVar2 = *(undefined8 *)
           &(p_Var5->
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>).
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.
            field_0x8;
  pMVar3 = (p_Var5->
           super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>).
           super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_xpr;
  lVar4 = (p_Var5->
          super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>).
          super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
          m_startRow.m_value;
  IVar6 = (p_Var5->
          super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>).
          super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
          m_outerStride;
  (this->m_arg).super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
  .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_startCol.
  m_value = (p_Var5->
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>).
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
            m_startCol.m_value;
  (this->m_arg).super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
  .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_outerStride
       = IVar6;
  (this->m_arg).super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
  .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_xpr = pMVar3
  ;
  (this->m_arg).super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
  .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_startRow.
  m_value = lVar4;
  (this->m_arg).super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
  .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.m_data =
       pfVar1;
  *(undefined8 *)
   &(this->m_arg).
    super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.field_0x8
       = uVar2;
  evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::evaluator
            (&this->m_argImpl,&this->m_arg);
  p_Var5 = Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>
           ::nestedExpression(replicate);
  IVar6 = MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>::rows
                    ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>
                      *)p_Var5);
  variable_if_dynamic<long,_4>::variable_if_dynamic
            ((variable_if_dynamic<long,_4> *)&this->field_0x40,IVar6);
  p_Var5 = Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>
           ::nestedExpression(replicate);
  IVar6 = MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>::cols
                    ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>
                      *)p_Var5);
  variable_if_dynamic<long,_1>::variable_if_dynamic
            ((variable_if_dynamic<long,_1> *)&this->field_0x41,IVar6);
  return;
}

Assistant:

explicit unary_evaluator(const XprType& replicate)
    : m_arg(replicate.nestedExpression()),
      m_argImpl(m_arg),
      m_rows(replicate.nestedExpression().rows()),
      m_cols(replicate.nestedExpression().cols())
  {}